

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)301>(Result *__return_storage_ptr__,Model *format)

{
  ModelDescription *description_00;
  bool bVar1;
  int32 modelVersion;
  SupportVectorsCase SVar2;
  int iVar3;
  CoreML *this;
  Kernel *kernel;
  SparseSupportVectors *this_00;
  DenseSupportVectors *this_01;
  Coefficients *this_02;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  int local_e4;
  int totalSVs;
  SupportVectorRegressor *local_b8;
  SupportVectorRegressor *svmSpec;
  undefined4 local_84;
  Result local_80;
  ModelDescription *local_48;
  ModelDescription *description;
  Result result;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = format;
  Result::Result((Result *)&description);
  local_48 = Specification::Model::description((Model *)result.m_message.field_2._8_8_);
  this = (CoreML *)Specification::ModelDescription::input(local_48);
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_80,this,features);
  Result::operator=((Result *)&description,&local_80);
  Result::~Result(&local_80);
  bVar1 = Result::good((Result *)&description);
  description_00 = local_48;
  if (bVar1) {
    modelVersion = Specification::Model::specificationversion
                             ((Model *)result.m_message.field_2._8_8_);
    validateRegressorInterface((Result *)&svmSpec,description_00,modelVersion);
    Result::operator=((Result *)&description,(Result *)&svmSpec);
    Result::~Result((Result *)&svmSpec);
    bVar1 = Result::good((Result *)&description);
    if (bVar1) {
      local_b8 = Specification::Model::supportvectorregressor
                           ((Model *)result.m_message.field_2._8_8_);
      kernel = Specification::SupportVectorRegressor::kernel(local_b8);
      validateKernel((Result *)&stack0xffffffffffffff20,kernel);
      Result::operator=((Result *)&description,(Result *)&stack0xffffffffffffff20);
      Result::~Result((Result *)&stack0xffffffffffffff20);
      bVar1 = Result::good((Result *)&description);
      if (bVar1) {
        local_e4 = 0;
        SVar2 = Specification::SupportVectorRegressor::supportVectors_case(local_b8);
        if (SVar2 == kSparseSupportVectors) {
          this_00 = Specification::SupportVectorRegressor::sparsesupportvectors(local_b8);
          local_e4 = Specification::SparseSupportVectors::vectors_size(this_00);
        }
        else {
          if (SVar2 != kDenseSupportVectors) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"Must specify sparse or dense support vectors",
                       &local_109);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator(&local_109);
            goto LAB_003e419f;
          }
          this_01 = Specification::SupportVectorRegressor::densesupportvectors(local_b8);
          local_e4 = Specification::DenseSupportVectors::vectors_size(this_01);
        }
        this_02 = Specification::SupportVectorRegressor::coefficients(local_b8);
        iVar3 = Specification::Coefficients::alpha_size(this_02);
        if (iVar3 == local_e4) {
          Result::Result(__return_storage_ptr__,(Result *)&description);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,
                     "The number of coefficients must match the number of support vectors.",
                     &local_131);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)&description);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)&description);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)&description);
  }
LAB_003e419f:
  local_84 = 1;
  Result::~Result((Result *)&description);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_supportVectorRegressor>(const Specification::Model& format) {

        Result result;
        const Specification::ModelDescription& description = format.description();

        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(description.input());
        if (!result.good()) {
            return result;
        }

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        result = validateRegressorInterface(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const Specification::SupportVectorRegressor& svmSpec = format.supportvectorregressor();

        result = validateKernel(svmSpec.kernel());
        if (!result.good()) {
            return result;
        }

        // Coefficient size must match the size of all support vectors
        int totalSVs = 0;
        switch (svmSpec.supportVectors_case()) {
            case Specification::SupportVectorRegressor::kSparseSupportVectors:
                totalSVs = svmSpec.sparsesupportvectors().vectors_size();
                break;
            case Specification::SupportVectorRegressor::kDenseSupportVectors:
                totalSVs = svmSpec.densesupportvectors().vectors_size();
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Must specify sparse or dense support vectors");
        }

        if(svmSpec.coefficients().alpha_size() != totalSVs) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "The number of coefficients must match the number of support vectors.");
        }

        return result;

    }